

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_token_write_quoted(fy_emitter *emit,fy_token *fyt,int flags,int indent,char qc)

{
  bool bVar1;
  _Bool _Var2;
  fy_atom_style fVar3;
  fy_atom_style fVar4;
  int iVar5;
  int iVar6;
  document_indicator dVar7;
  int local_2d4;
  int local_2c4;
  int local_2b4;
  int local_2a4;
  int local_284;
  int local_274;
  byte local_265;
  fy_emitter_write_type local_264;
  ulong local_260;
  size_t k;
  size_t non_utf8_len;
  uint8_t non_utf8 [4];
  uint32_t lo_surrogate;
  uint32_t hi_surrogate;
  fy_atom_style target_style;
  fy_atom_iter iter;
  fy_atom *atom;
  _Bool done_esc;
  size_t sStack_48;
  _Bool should_indent;
  size_t len;
  char *str;
  fy_emitter_write_type wtype;
  int digit;
  int w;
  int i;
  int c;
  _Bool breaks;
  _Bool spaces;
  _Bool allow_breaks;
  char qc_local;
  int indent_local;
  int flags_local;
  fy_token *fyt_local;
  fy_emitter *emit_local;
  
  len = 0;
  sStack_48 = 0;
  if (qc == '\'') {
    local_264 = fyewt_single_quoted_scalar;
    if ((flags & 0x40U) != 0) {
      local_264 = fyewt_single_quoted_scalar_key;
    }
  }
  else {
    local_264 = fyewt_double_quoted_scalar;
    if ((flags & 0x40U) != 0) {
      local_264 = fyewt_double_quoted_scalar_key;
    }
  }
  str._0_4_ = local_264;
  dVar7 = di_double_quote_start;
  if (qc == '\'') {
    dVar7 = di_single_quote_start;
  }
  i._3_1_ = qc;
  c = indent;
  _breaks = flags;
  _indent_local = fyt;
  fyt_local = (fy_token *)emit;
  fy_emit_write_indicator(emit,dVar7,flags,indent,local_264);
  if (_indent_local != (fy_token *)0x0) {
    fVar3 = FYAS_SINGLE_QUOTED;
    if (i._3_1_ == '\"') {
      fVar3 = FYAS_DOUBLE_QUOTED;
    }
    len = (size_t)fy_token_get_direct_output(_indent_local,&stack0xffffffffffffffb8);
    if (((char *)len == (char *)0x0) || (fVar4 = fy_token_atom_style(_indent_local), fVar4 != fVar3)
       ) {
      iter._480_8_ = fy_token_atom(_indent_local);
      if ((fy_atom *)iter._480_8_ != (fy_atom *)0x0) {
        local_265 = 0;
        if ((_breaks & 8) == 0) {
          _Var2 = fy_emit_is_json_mode((fy_emitter *)fyt_local);
          local_265 = 0;
          if (!_Var2) {
            _Var2 = fy_emit_is_oneline((fy_emitter *)fyt_local);
            local_265 = _Var2 ^ 0xff;
          }
        }
        i._2_1_ = local_265 & 1;
        i._1_1_ = 0;
        i._0_1_ = 0;
        fy_atom_iter_start((fy_atom *)iter._480_8_,(fy_atom_iter *)&hi_surrogate);
        fy_emit_accum_start((fy_emit_accum *)&fyt_local->text0,(fy_emitter_write_type)str);
        while( true ) {
          k = 4;
          w = fy_atom_iter_utf8_quoted_get
                        ((fy_atom_iter *)&hi_surrogate,&k,(uint8_t *)&non_utf8_len);
          if (w < 0) break;
          if ((w == 0) && (k != 0)) {
            for (local_260 = 0; local_260 < k; local_260 = local_260 + 1) {
              w = (int)non_utf8[local_260 - 8];
              fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x5c);
              fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x78);
              str._4_4_ = (uint)w >> 4 & 0xf;
              if (str._4_4_ < 10) {
                local_274 = str._4_4_ + 0x30;
              }
              else {
                local_274 = str._4_4_ + 0x37;
              }
              fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,local_274);
              str._4_4_ = w & 0xf;
              if (str._4_4_ < 10) {
                local_284 = str._4_4_ + 0x30;
              }
              else {
                local_284 = str._4_4_ + 0x37;
              }
              fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,local_284);
            }
          }
          else {
            _Var2 = fy_is_space(w);
            if ((_Var2) || ((i._3_1_ == '\'' && (_Var2 = fy_is_ws(w), _Var2)))) {
              bVar1 = false;
              if (((i._2_1_ & 1) != 0) && (bVar1 = false, (i._1_1_ & 1) == 0)) {
                iVar5 = fy_emit_accum_column((fy_emit_accum *)&fyt_local->text0);
                iVar6 = fy_emit_width((fy_emitter *)fyt_local);
                bVar1 = iVar6 < iVar5;
              }
              if (bVar1) {
                if (i._3_1_ == '\'') {
                  iVar5 = fy_atom_iter_utf8_peek((fy_atom_iter *)&hi_surrogate);
                  _Var2 = fy_is_ws(iVar5);
                  if (!_Var2) goto LAB_00136d6c;
                }
                else {
LAB_00136d6c:
                  if (i._3_1_ != '\"') goto LAB_00136dd0;
                }
                fy_emit_accum_output((fy_emit_accum *)&fyt_local->text0);
                if (i._3_1_ == '\"') {
                  iVar5 = fy_atom_iter_utf8_peek((fy_atom_iter *)&hi_surrogate);
                  _Var2 = fy_is_ws(iVar5);
                  if (_Var2) {
                    fy_emit_putc((fy_emitter *)fyt_local,(fy_emitter_write_type)str,0x5c);
                  }
                }
                *(uint *)((long)&(fyt_local->node).prev + 4) =
                     *(uint *)((long)&(fyt_local->node).prev + 4) & 0xfffffffd;
                fy_emit_write_indent((fy_emitter *)fyt_local,c);
              }
              else {
LAB_00136dd0:
                fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,w);
              }
              i._1_1_ = 1;
              i._0_1_ = 0;
            }
            else if ((i._3_1_ == '\'') && (_Var2 = fy_is_lb(w), _Var2)) {
              if ((i._2_1_ & 1) == 0) break;
              if (((byte)i & 1) == 0) {
                fy_emit_accum_output((fy_emit_accum *)&fyt_local->text0);
                fy_emit_write_indent((fy_emitter *)fyt_local,c);
              }
              *(uint *)((long)&(fyt_local->node).prev + 4) =
                   *(uint *)((long)&(fyt_local->node).prev + 4) & 0xfffffffd;
              fy_emit_write_indent((fy_emitter *)fyt_local,c);
              i._0_1_ = 1;
            }
            else {
              if (((byte)i & 1) != 0) {
                fy_emit_accum_output((fy_emit_accum *)&fyt_local->text0);
                fy_emit_write_indent((fy_emitter *)fyt_local,c);
              }
              if ((i._3_1_ == '\'') && (w == 0x27)) {
                fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x27);
                fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x27);
              }
              else if ((i._3_1_ != '\"') ||
                      ((((_Var2 = fy_is_printq(w), _Var2 && (w != 0x22)) && (w != 0x5c)) &&
                       ((_Var2 = fy_emit_is_json_mode((fy_emitter *)fyt_local), !_Var2 ||
                        (_Var2 = fy_is_json_unescaped(w), _Var2)))))) {
                fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,w);
              }
              else {
                fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x5c);
                bVar1 = false;
                if (w == 8) {
                  fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x62);
                  bVar1 = true;
                }
                else if (w == 9) {
                  fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x74);
                  bVar1 = true;
                }
                else if (w == 10) {
                  fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x6e);
                  bVar1 = true;
                }
                else if (w == 0xc) {
                  fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x66);
                  bVar1 = true;
                }
                else if (w == 0xd) {
                  fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x72);
                  bVar1 = true;
                }
                else if (w == 0x22) {
                  fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x22);
                  bVar1 = true;
                }
                else if (w == 0x5c) {
                  fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x5c);
                  bVar1 = true;
                }
                if (!bVar1) {
                  _Var2 = fy_emit_is_json_mode((fy_emitter *)fyt_local);
                  if (_Var2) {
                    wtype = fyewt_indicator;
                    if ((uint)w < 0x10000) {
                      fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x75);
                      digit = wtype;
                      while (digit = digit - fyewt_tag_directive, -1 < digit) {
                        str._4_4_ = (uint)w >> ((char)digit * '\x04' & 0x1fU) & 0xf;
                        if (str._4_4_ < 10) {
                          local_2b4 = str._4_4_ + 0x30;
                        }
                        else {
                          local_2b4 = str._4_4_ + 0x37;
                        }
                        fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,local_2b4);
                      }
                    }
                    else {
                      non_utf8 = (uint8_t  [4])
                                 (((w >> 0x10 & 0x1fU) - 1) * 0x40 | 0xd800 | w >> 10 & 0x3fU);
                      non_utf8_len._4_4_ = w & 0x3ffU | 0xdc00;
                      fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x75);
                      digit = wtype;
                      while (digit = digit - fyewt_tag_directive, -1 < digit) {
                        str._4_4_ = (uint)non_utf8 >> ((char)digit * '\x04' & 0x1fU) & 0xf;
                        if (str._4_4_ < 10) {
                          local_2c4 = str._4_4_ + 0x30;
                        }
                        else {
                          local_2c4 = str._4_4_ + 0x37;
                        }
                        fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,local_2c4);
                      }
                      fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x5c);
                      fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x75);
                      digit = wtype;
                      while (digit = digit - fyewt_tag_directive, -1 < digit) {
                        str._4_4_ = non_utf8_len._4_4_ >> ((char)digit * '\x04' & 0x1fU) & 0xf;
                        if (str._4_4_ < 10) {
                          local_2d4 = str._4_4_ + 0x30;
                        }
                        else {
                          local_2d4 = str._4_4_ + 0x37;
                        }
                        fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,local_2d4);
                      }
                    }
                  }
                  else if (w == 0) {
                    fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x30);
                  }
                  else if (w == 7) {
                    fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x61);
                  }
                  else if (w == 0xb) {
                    fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x76);
                  }
                  else if (w == 0x1b) {
                    fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x65);
                  }
                  else if (w == 0x85) {
                    fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x4e);
                  }
                  else if (w == 0xa0) {
                    fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x5f);
                  }
                  else if (w == 0x2028) {
                    fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x4c);
                  }
                  else if (w == 0x2029) {
                    fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x50);
                  }
                  else {
                    if ((uint)w < 0x100) {
                      fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x78);
                      wtype = fyewt_version_directive;
                      digit = wtype;
                    }
                    else if ((uint)w < 0x10000) {
                      fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x75);
                      wtype = fyewt_indicator;
                      digit = wtype;
                    }
                    else {
                      fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,0x55);
                      wtype = fyewt_double_quoted_scalar;
                      digit = wtype;
                    }
                    while (digit = digit - fyewt_tag_directive, -1 < digit) {
                      str._4_4_ = (uint)w >> ((char)digit * '\x04' & 0x1fU) & 0xf;
                      if (str._4_4_ < 10) {
                        local_2a4 = str._4_4_ + 0x30;
                      }
                      else {
                        local_2a4 = str._4_4_ + 0x37;
                      }
                      fy_emit_accum_utf8_put((fy_emit_accum *)&fyt_local->text0,local_2a4);
                    }
                  }
                }
              }
              *(uint *)((long)&(fyt_local->node).prev + 4) =
                   *(uint *)((long)&(fyt_local->node).prev + 4) & 0xfffffffd;
              i._1_1_ = 0;
              i._0_1_ = 0;
            }
          }
        }
        fy_emit_accum_output((fy_emit_accum *)&fyt_local->text0);
        fy_emit_accum_finish((fy_emit_accum *)&fyt_local->text0);
        fy_atom_iter_finish((fy_atom_iter *)&hi_surrogate);
      }
    }
    else {
      fy_emit_write((fy_emitter *)fyt_local,(fy_emitter_write_type)str,(char *)len,(int)sStack_48);
    }
  }
  dVar7 = di_double_quote_end;
  if (i._3_1_ == '\'') {
    dVar7 = di_single_quote_end;
  }
  fy_emit_write_indicator((fy_emitter *)fyt_local,dVar7,_breaks,c,(fy_emitter_write_type)str);
  return;
}

Assistant:

void fy_emit_token_write_quoted(struct fy_emitter *emit, struct fy_token *fyt, int flags, int indent, char qc) {
    bool allow_breaks, spaces, breaks;
    int c, i, w, digit;
    enum fy_emitter_write_type wtype;
    const char *str = NULL;
    size_t len = 0;
    bool should_indent, done_esc;
    struct fy_atom *atom;
    struct fy_atom_iter iter;
    enum fy_atom_style target_style;
    uint32_t hi_surrogate, lo_surrogate;
    uint8_t non_utf8[4];
    size_t non_utf8_len, k;

    wtype = qc == '\'' ?
            ((flags & DDNF_SIMPLE_SCALAR_KEY) ?
             fyewt_single_quoted_scalar_key : fyewt_single_quoted_scalar) :
            ((flags & DDNF_SIMPLE_SCALAR_KEY) ?
             fyewt_double_quoted_scalar_key : fyewt_double_quoted_scalar);

    fy_emit_write_indicator(emit,
                            qc == '\'' ? di_single_quote_start : di_double_quote_start,
                            flags, indent, wtype);

    /* XXX check whether this is ever the case */
    if (!fyt)
        goto out;

    /* note that if the original target style and the target differ
     * we can note use direct output
     */
    target_style = qc == '"' ? FYAS_DOUBLE_QUOTED : FYAS_SINGLE_QUOTED;

    /* simple case of direct output (large amount of cases) */
    str = fy_token_get_direct_output(fyt, &len);
    if (str && fy_token_atom_style(fyt) == target_style) {
        fy_emit_write(emit, wtype, str, len);
        goto out;
    }

    /* no atom? i.e. empty */
    atom = fy_token_atom(fyt);
    if (!atom)
        goto out;

    allow_breaks = !(flags & DDNF_SIMPLE) && !fy_emit_is_json_mode(emit) && !fy_emit_is_oneline(emit);

    spaces = false;
    breaks = false;

    fy_atom_iter_start(atom, &iter);
    fy_emit_accum_start(&emit->ea, wtype);
    for (;;) {
        non_utf8_len = sizeof(non_utf8);
        c = fy_atom_iter_utf8_quoted_get(&iter, &non_utf8_len, non_utf8);
        if (c < 0)
            break;

        if (c == 0 && non_utf8_len > 0) {
            for (k = 0; k < non_utf8_len; k++) {
                c = (int) non_utf8[k] & 0xff;
                fy_emit_accum_utf8_put(&emit->ea, '\\');
                fy_emit_accum_utf8_put(&emit->ea, 'x');
                digit = ((unsigned int) c >> 4) & 15;
                fy_emit_accum_utf8_put(&emit->ea,
                                       digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                digit = (unsigned int) c & 15;
                fy_emit_accum_utf8_put(&emit->ea,
                                       digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
            }
            continue;
        }

        if (fy_is_space(c) || (qc == '\'' && fy_is_ws(c))) {
            should_indent = allow_breaks && !spaces &&
                            fy_emit_accum_column(&emit->ea) > fy_emit_width(emit);

            if (should_indent &&
                ((qc == '\'' && fy_is_ws(fy_atom_iter_utf8_peek(&iter))) ||
                 qc == '"')) {
                fy_emit_accum_output(&emit->ea);

                if (qc == '"' && fy_is_ws(fy_atom_iter_utf8_peek(&iter)))
                    fy_emit_putc(emit, wtype, '\\');

                emit->flags &= ~FYEF_INDENTATION;
                fy_emit_write_indent(emit, indent);
            } else
                fy_emit_accum_utf8_put(&emit->ea, c);

            spaces = true;
            breaks = false;

        } else if (qc == '\'' && fy_is_lb(c)) {

            /* blergh */
            if (!allow_breaks)
                break;

            /* output run */
            if (!breaks) {
                fy_emit_accum_output(&emit->ea);
                fy_emit_write_indent(emit, indent);
            }

            emit->flags &= ~FYEF_INDENTATION;
            fy_emit_write_indent(emit, indent);

            breaks = true;
        } else {
            /* output run */
            if (breaks) {
                fy_emit_accum_output(&emit->ea);
                fy_emit_write_indent(emit, indent);
            }

            /* escape */
            if (qc == '\'' && c == '\'') {
                fy_emit_accum_utf8_put(&emit->ea, '\'');
                fy_emit_accum_utf8_put(&emit->ea, '\'');
            } else if (qc == '"' &&
                       ((!fy_is_printq(c) || c == '"' || c == '\\') ||
                        (fy_emit_is_json_mode(emit) && !fy_is_json_unescaped(c)))) {

                fy_emit_accum_utf8_put(&emit->ea, '\\');

                /* common YAML and JSON escapes */
                done_esc = false;
                switch (c) {
                    case '\b':
                        fy_emit_accum_utf8_put(&emit->ea, 'b');
                        done_esc = true;
                        break;
                    case '\f':
                        fy_emit_accum_utf8_put(&emit->ea, 'f');
                        done_esc = true;
                        break;
                    case '\n':
                        fy_emit_accum_utf8_put(&emit->ea, 'n');
                        done_esc = true;
                        break;
                    case '\r':
                        fy_emit_accum_utf8_put(&emit->ea, 'r');
                        done_esc = true;
                        break;
                    case '\t':
                        fy_emit_accum_utf8_put(&emit->ea, 't');
                        done_esc = true;
                        break;
                    case '"':
                        fy_emit_accum_utf8_put(&emit->ea, '"');
                        done_esc = true;
                        break;
                    case '\\':
                        fy_emit_accum_utf8_put(&emit->ea, '\\');
                        done_esc = true;
                        break;
                }

                if (done_esc)
                    goto done;

                if (!fy_emit_is_json_mode(emit)) {
                    switch (c) {
                        case '\0':
                            fy_emit_accum_utf8_put(&emit->ea, '0');
                            break;
                        case '\a':
                            fy_emit_accum_utf8_put(&emit->ea, 'a');
                            break;
                        case '\v':
                            fy_emit_accum_utf8_put(&emit->ea, 'v');
                            break;
                        case '\e':
                            fy_emit_accum_utf8_put(&emit->ea, 'e');
                            break;
                        case 0x85:
                            fy_emit_accum_utf8_put(&emit->ea, 'N');
                            break;
                        case 0xa0:
                            fy_emit_accum_utf8_put(&emit->ea, '_');
                            break;
                        case 0x2028:
                            fy_emit_accum_utf8_put(&emit->ea, 'L');
                            break;
                        case 0x2029:
                            fy_emit_accum_utf8_put(&emit->ea, 'P');
                            break;
                        default:
                            if ((unsigned int) c <= 0xff) {
                                fy_emit_accum_utf8_put(&emit->ea, 'x');
                                w = 2;
                            } else if ((unsigned int) c <= 0xffff) {
                                fy_emit_accum_utf8_put(&emit->ea, 'u');
                                w = 4;
                            } else if ((unsigned int) c <= 0xffffffff) {
                                fy_emit_accum_utf8_put(&emit->ea, 'U');
                                w = 8;
                            }

                            for (i = w - 1; i >= 0; i--) {
                                digit = ((unsigned int) c >> (i * 4)) & 15;
                                fy_emit_accum_utf8_put(&emit->ea,
                                                       digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                            }
                            break;
                    }

                } else {
                    /* JSON escapes all others in \uXXXX and \uXXXX\uXXXX */
                    w = 4;
                    if ((unsigned int) c <= 0xffff) {
                        fy_emit_accum_utf8_put(&emit->ea, 'u');
                        for (i = w - 1; i >= 0; i--) {
                            digit = ((unsigned int) c >> (i * 4)) & 15;
                            fy_emit_accum_utf8_put(&emit->ea,
                                                   digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                        }
                    } else {
                        hi_surrogate = 0xd800 | ((((c >> 16) & 0x1f) - 1) << 6) | ((c >> 10) & 0x3f);
                        lo_surrogate = 0xdc00 | (c & 0x3ff);

                        fy_emit_accum_utf8_put(&emit->ea, 'u');
                        for (i = w - 1; i >= 0; i--) {
                            digit = ((unsigned int) hi_surrogate >> (i * 4)) & 15;
                            fy_emit_accum_utf8_put(&emit->ea,
                                                   digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                        }

                        fy_emit_accum_utf8_put(&emit->ea, '\\');
                        fy_emit_accum_utf8_put(&emit->ea, 'u');
                        for (i = w - 1; i >= 0; i--) {
                            digit = ((unsigned int) lo_surrogate >> (i * 4)) & 15;
                            fy_emit_accum_utf8_put(&emit->ea,
                                                   digit <= 9 ? ('0' + digit) : ('A' + digit - 10));
                        }
                    }
                }
            } else
                fy_emit_accum_utf8_put(&emit->ea, c);
            done:
            emit->flags &= ~FYEF_INDENTATION;
            spaces = false;
            breaks = false;
        }
    }
    fy_emit_accum_output(&emit->ea);
    fy_emit_accum_finish(&emit->ea);
    fy_atom_iter_finish(&iter);

    out:
    fy_emit_write_indicator(emit,
                            qc == '\'' ? di_single_quote_end : di_double_quote_end,
                            flags, indent, wtype);
}